

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cldperm.c
# Opt level: O2

int cldperm(int job,int n,int_t nnz,int_t *colptr,int_t *adjncy,singlecomplex *nzval,int *perm,
           float *u,float *v)

{
  double *addr;
  int_t *addr_00;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  double dVar7;
  int_t num;
  int_t nnz_local;
  ulong local_198;
  double *local_190;
  int_t ln;
  int_t ljob;
  int_t ldw;
  int_t local_17c;
  double *local_178;
  int_t *local_170;
  int_t info [10];
  int_t icntl [10];
  
  nnz_local = nnz;
  local_190 = (double *)superlu_malloc((long)nnz * 8);
  local_17c = n * 10 + nnz;
  if (job != 3) {
    local_17c = n * 5;
  }
  local_198 = (ulong)(uint)n;
  local_170 = intMalloc(local_17c);
  if (local_170 != (int_t *)0x0) {
    iVar5 = (int)local_198;
    ldw = iVar5 * 3 + nnz;
    local_178 = (double *)superlu_malloc((long)ldw << 3);
    if (local_178 != (double *)0x0) {
      lVar4 = (long)iVar5;
      for (lVar1 = 0; lVar1 <= lVar4; lVar1 = lVar1 + 1) {
        colptr[lVar1] = colptr[lVar1] + 1;
      }
      uVar2 = 0;
      uVar6 = (ulong)(uint)nnz;
      if (nnz < 1) {
        uVar6 = uVar2;
      }
      for (; uVar6 != uVar2; uVar2 = uVar2 + 1) {
        adjncy[uVar2] = adjncy[uVar2] + 1;
      }
      mc64id_(icntl);
      ln = (int_t)local_198;
      ljob = job;
      for (lVar1 = 0; addr_00 = local_170, addr = local_178, lVar1 < nnz; lVar1 = lVar1 + 1) {
        dVar7 = c_abs1(nzval);
        local_190[lVar1] = dVar7;
        nzval = nzval + 1;
      }
      mc64ad_(&ljob,&ln,&nnz_local,colptr,adjncy,local_190,&num,perm,&local_17c,local_170,&ldw,
              local_178,icntl,info);
      uVar6 = local_198;
      iVar5 = (int)local_198;
      if (info[0] == 1) {
        printf(".. The last %d permutations:\n",(ulong)(uint)(iVar5 - num));
        slu_PrintInt10("perm",iVar5 - num,perm + num);
      }
      for (lVar1 = 0; lVar1 <= lVar4; lVar1 = lVar1 + 1) {
        colptr[lVar1] = colptr[lVar1] + -1;
      }
      uVar3 = 0;
      uVar2 = (ulong)(uint)nnz_local;
      if (nnz_local < 1) {
        uVar2 = uVar3;
      }
      for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        adjncy[uVar3] = adjncy[uVar3] + -1;
      }
      uVar2 = 0;
      uVar6 = uVar6 & 0xffffffff;
      if (iVar5 < 1) {
        uVar6 = uVar2;
      }
      for (; uVar6 != uVar2; uVar2 = uVar2 + 1) {
        perm[uVar2] = perm[uVar2] + -1;
      }
      if (job == 5) {
        for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
          u[uVar2] = (float)addr[uVar2];
          v[uVar2] = (float)addr[lVar4 + uVar2];
        }
      }
      superlu_free(addr_00);
      superlu_free(addr);
      superlu_free(local_190);
      return info[0];
    }
    sprintf((char *)icntl,"%s at line %d in file %s\n","Malloc fails for dw[]",0x72,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cldperm.c");
    superlu_abort_and_exit((char *)icntl);
  }
  sprintf((char *)icntl,"%s at line %d in file %s\n","Malloc fails for iw[]",0x6f,
          "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cldperm.c");
  superlu_abort_and_exit((char *)icntl);
}

Assistant:

int
cldperm(int job, int n, int_t nnz, int_t colptr[], int_t adjncy[],
	singlecomplex nzval[], int *perm, float u[], float v[])
{
    int_t i, num;
    int_t icntl[10], info[10];
    int_t liw, ldw, *iw;
    double *dw;
    double *nzval_d = (double *) SUPERLU_MALLOC(nnz * sizeof(double));

#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Enter cldperm()");
#endif
    liw = 5*n;
    if ( job == 3 ) liw = 10*n + nnz;
    if ( !(iw = intMalloc(liw)) ) ABORT("Malloc fails for iw[]");
    ldw = 3*n + nnz;
    if ( !(dw = (double*) SUPERLU_MALLOC(ldw * sizeof(double))) )
          ABORT("Malloc fails for dw[]");
	    
    /* Increment one to get 1-based indexing. */
    for (i = 0; i <= n; ++i) ++colptr[i];
    for (i = 0; i < nnz; ++i) ++adjncy[i];
#if ( DEBUGlevel>=2 )
    printf("LDPERM(): n %d, nnz %lld\n", n, (long long) nnz);
    slu_PrintInt10("colptr", n+1, colptr);
    slu_PrintInt10("adjncy", nnz, adjncy);
#endif
	
    /* 
     * NOTE:
     * =====
     *
     * MC64AD assumes that column permutation vector is defined as:
     * perm(i) = j means column i of permuted A is in column j of original A.
     *
     * Since a symmetric permutation preserves the diagonal entries. Then
     * by the following relation:
     *     P'(A*P')P = P'A
     * we can apply inverse(perm) to rows of A to get large diagonal entries.
     * But, since 'perm' defined in MC64AD happens to be the reverse of
     * SuperLU's definition of permutation vector, therefore, it is already
     * an inverse for our purpose. We will thus use it directly.
     *
     */
    mc64id_(icntl);
#if 0
    /* Suppress error and warning messages. */
    icntl[0] = -1;
    icntl[1] = -1;
#endif

    int_t ljob = job, ln = n;
    
    for (i = 0; i < nnz; ++i) nzval_d[i] = c_abs1(&nzval[i]);
    mc64ad_(&ljob, &ln, &nnz, colptr, adjncy, nzval_d, &num, perm,
	    &liw, iw, &ldw, dw, icntl, info);

#if ( DEBUGlevel>=2 )
    slu_PrintInt10("perm", n, perm);
    printf(".. After MC64AD info %lld\tsize of matching %lld\n", (long long)info[0], (long long) num);
#endif
    if ( info[0] == 1 ) { /* Structurally singular */
        printf(".. The last %d permutations:\n", (int)(n-num));
	slu_PrintInt10("perm", n-num, &perm[num]);
    }

    /* Restore to 0-based indexing. */
    for (i = 0; i <= n; ++i) --colptr[i];
    for (i = 0; i < nnz; ++i) --adjncy[i];
    for (i = 0; i < n; ++i) --perm[i];

    if ( job == 5 )
        for (i = 0; i < n; ++i) {
	    u[i] = dw[i];
	    v[i] = dw[n+i];
	}

    SUPERLU_FREE(iw);
    SUPERLU_FREE(dw);
    SUPERLU_FREE(nzval_d);

#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Exit cldperm()");
#endif

    return info[0];
}